

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_copy_image_section(fitsfile *fptr,fitsfile *newptr,char *expr,int *status)

{
  long lVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  fitsfile *fptr_00;
  void *__ptr;
  long lVar7;
  fitsfile *in_RCX;
  undefined8 in_RDX;
  long *unaff_RBX;
  undefined8 in_RDI;
  double dVar8;
  long *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  fitsfile *in_stack_00000010;
  int in_stack_00000018;
  int in_stack_0000001c;
  fitsfile *in_stack_00000020;
  double cdelt;
  double crpix;
  double *buffer;
  long buffsize;
  long outsize;
  long outnaxes [9];
  char *in_stack_00000098;
  int jj;
  int kk;
  int klen;
  long iiter;
  long jiter;
  long kiter;
  long nrowiter;
  long nsliceiter;
  long ncubeiter;
  long firstpix;
  long maxcube;
  long mincube;
  long maxslice;
  long minslice;
  long maxrow;
  long minrow;
  int anynull;
  int tstatus;
  int ii;
  char card [81];
  char keyname [75];
  char *cptr;
  long incs [9];
  long lpixels [9];
  long fpixels [9];
  long sinc;
  long smax;
  long smin;
  long naxes [9];
  int nkey;
  int numkeys;
  int naxis;
  int bitpix;
  int *in_stack_fffffffffffffc98;
  int *in_stack_fffffffffffffca0;
  fitsfile *in_stack_fffffffffffffca8;
  int *in_stack_fffffffffffffcb0;
  int *status_00;
  fitsfile *in_stack_fffffffffffffcb8;
  int *in_stack_fffffffffffffcc0;
  fitsfile *in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  fitsfile *in_stack_fffffffffffffcd8;
  fitsfile *in_stack_fffffffffffffce8;
  fitsfile *fptr_01;
  int *in_stack_fffffffffffffcf8;
  long *in_stack_fffffffffffffd00;
  long *in_stack_fffffffffffffd08;
  long *in_stack_fffffffffffffd10;
  fitsfile *in_stack_fffffffffffffd18;
  int local_2cc;
  int local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  int *in_stack_fffffffffffffd88;
  int *in_stack_fffffffffffffd90;
  long lVar9;
  char *in_stack_fffffffffffffd98;
  long lVar10;
  int *in_stack_fffffffffffffda0;
  long lVar11;
  fitsfile *in_stack_fffffffffffffda8;
  undefined4 uVar12;
  fitsfile *in_stack_fffffffffffffdb8;
  char local_1e8 [88];
  undefined8 local_190;
  long local_188 [10];
  long local_138 [10];
  long local_e8 [9];
  long local_a0;
  long local_98;
  long local_90;
  long local_88 [9];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  fitsfile *local_30;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  memcpy(local_88,&DAT_002f2d60,0x48);
  memcpy(local_e8,&DAT_002f2db0,0x48);
  memcpy(local_138,&DAT_002f2e00,0x48);
  memcpy(local_188,&DAT_002f2e50,0x48);
  if (local_30->HDUposition < 1) {
    ffgidt(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    ffgidm(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    iVar4 = ffgisz(in_stack_fffffffffffffcb8,(int)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                   (long *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    if (iVar4 < 1) {
      if ((local_38 < 1) || (4 < local_38)) {
        ffpmsg((char *)0x1335d8);
        local_30->HDUposition = 0xd4;
        iVar4 = 0xd4;
      }
      else {
        ffcrim(in_stack_fffffffffffffcc8,(int)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
               (int)in_stack_fffffffffffffcc0,(long *)in_stack_fffffffffffffcb8,
               in_stack_fffffffffffffcb0);
        ffghsp(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (int *)0x133642);
        for (local_40 = 4; local_40 <= local_3c; local_40 = local_40 + 1) {
          ffgrec(in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                 (char *)in_stack_fffffffffffffc98,(int *)0x133681);
          iVar4 = ffgkcl(in_stack_00000098);
          if (0x14 < iVar4) {
            ffprec(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,
                   (int *)in_stack_fffffffffffffd08);
          }
        }
        if (local_30->HDUposition < 1) {
          local_190 = local_28;
          for (iVar4 = 0; iVar4 < local_38; iVar4 = iVar4 + 1) {
            iVar5 = fits_get_section_range
                              ((char **)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                               in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                               in_stack_fffffffffffffcf8);
            if (0 < iVar5) {
              ffpmsg((char *)0x133761);
              ffpmsg((char *)0x13376e);
              return local_30->HDUposition;
            }
            if (local_98 == 0) {
              local_98 = local_88[iVar4];
            }
            else if (local_90 == 0) {
              local_90 = local_88[iVar4];
            }
            if ((local_88[iVar4] < local_90) || (local_88[iVar4] < local_98)) {
              ffpmsg((char *)0x13380e);
              ffpmsg((char *)0x13381b);
              local_30->HDUposition = 0xd4;
              return 0xd4;
            }
            local_e8[iVar4] = local_90;
            local_138[iVar4] = local_98;
            local_188[iVar4] = local_a0;
            if (local_98 < local_90) {
              *(long *)(&stack0xfffffffffffffce8 + (long)iVar4 * 8) =
                   ((local_90 - local_98) + local_a0) / local_a0;
            }
            else {
              *(long *)(&stack0xfffffffffffffce8 + (long)iVar4 * 8) =
                   ((local_98 - local_90) + local_a0) / local_a0;
            }
            ffkeyn((char *)in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20)
                   ,(char *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
            ffmkyj(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                   (LONGLONG)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd88);
            if ((local_e8[iVar4] != 1) || (local_188[iVar4] != 1)) {
              for (local_2c8 = -1; local_2c8 < 0x1a; local_2c8 = local_2c8 + 1) {
                ffkeyn((char *)in_stack_fffffffffffffcd8,
                       (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                       (char *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
                cVar2 = (char)local_2c8;
                if (local_2c8 != -1) {
                  sVar6 = strlen(local_1e8);
                  local_1e8[(int)sVar6] = cVar2 + 'A';
                  local_1e8[(int)sVar6 + 1] = '\0';
                }
                uVar12 = 0;
                iVar5 = ffgky(in_stack_fffffffffffffcd8,
                              (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                              (char *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                              (char *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
                if (iVar5 == 0) {
                  if (local_138[iVar4] < local_e8[iVar4]) {
                    dVar8 = ((double)local_e8[iVar4] - (double)in_stack_fffffffffffffcc8) /
                            (double)local_188[iVar4];
                  }
                  else {
                    dVar8 = ((double)in_stack_fffffffffffffcc8 - (double)local_e8[iVar4]) /
                            (double)local_188[iVar4];
                  }
                  in_stack_fffffffffffffcc8 = (fitsfile *)(dVar8 + 1.0);
                  ffmkyd(in_stack_fffffffffffffdb8,(char *)CONCAT44(iVar4,uVar12),
                         (double)in_stack_fffffffffffffda8,
                         (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),in_stack_fffffffffffffd98,
                         in_stack_fffffffffffffd90);
                  if ((local_188[iVar4] != 1) || (local_138[iVar4] < local_e8[iVar4])) {
                    ffkeyn((char *)in_stack_fffffffffffffcd8,
                           (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                           (char *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
                    if (local_2c8 != -1) {
                      sVar6 = strlen(local_1e8);
                      local_1e8[(int)sVar6] = cVar2 + 'A';
                      local_1e8[(int)sVar6 + 1] = '\0';
                    }
                    uVar12 = 0;
                    iVar5 = ffgky(in_stack_fffffffffffffcd8,
                                  (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                                  (char *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                  (char *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
                    if (iVar5 == 0) {
                      if (local_138[iVar4] < local_e8[iVar4]) {
                        lVar1 = -local_188[iVar4];
                      }
                      else {
                        lVar1 = local_188[iVar4];
                      }
                      in_stack_fffffffffffffcc0 =
                           (int *)((double)in_stack_fffffffffffffcc0 * (double)lVar1);
                      ffmkyd(in_stack_fffffffffffffdb8,(char *)CONCAT44(iVar4,uVar12),
                             (double)in_stack_fffffffffffffda8,
                             (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                             in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
                    }
                    ffkeyn((char *)in_stack_fffffffffffffcd8,
                           (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                           (char *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
                    if (local_2c8 != -1) {
                      sVar6 = strlen(local_1e8);
                      local_1e8[(int)sVar6] = cVar2 + 'A';
                      local_1e8[(int)sVar6 + 1] = '\0';
                    }
                    for (local_2cc = 0; local_2cc < 9; local_2cc = local_2cc + 1) {
                      local_1e8[2] = (char)local_2cc + '1';
                      uVar12 = 0;
                      iVar5 = ffgky(in_stack_fffffffffffffcd8,
                                    (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                                    (char *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                    (char *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
                      if (iVar5 == 0) {
                        if (local_138[iVar4] < local_e8[iVar4]) {
                          lVar1 = -local_188[iVar4];
                        }
                        else {
                          lVar1 = local_188[iVar4];
                        }
                        in_stack_fffffffffffffcc0 =
                             (int *)((double)in_stack_fffffffffffffcc0 * (double)lVar1);
                        ffmkyd(in_stack_fffffffffffffdb8,(char *)CONCAT44(iVar4,uVar12),
                               (double)in_stack_fffffffffffffda8,
                               (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                               in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
                      }
                    }
                  }
                }
              }
            }
          }
          iVar4 = ffrdef(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
          if (iVar4 < 1) {
            ffpscl(in_stack_fffffffffffffcb8,(double)in_stack_fffffffffffffcb0,
                   (double)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
            ffpscl(in_stack_fffffffffffffcb8,(double)in_stack_fffffffffffffcb0,
                   (double)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
            iVar4 = local_34;
            if (local_34 < 1) {
              iVar4 = -local_34;
            }
            fptr_00 = (fitsfile *)((long)(iVar4 / 8) * (long)in_stack_fffffffffffffce8);
            fptr_01 = in_stack_fffffffffffffce8;
            __ptr = malloc((size_t)fptr_00);
            lVar3 = local_e8[3];
            lVar1 = local_138[3];
            if (__ptr == (void *)0x0) {
              ffpmsg((char *)0x133f20);
              local_30->HDUposition = 0x71;
              iVar4 = 0x71;
            }
            else {
              if (local_138[1] < local_e8[1]) {
                lVar7 = local_e8[1] - local_138[1];
              }
              else {
                lVar7 = local_138[1] - local_e8[1];
              }
              local_2a8 = (lVar7 + local_188[1]) / local_188[1];
              if (local_138[2] < local_e8[2]) {
                lVar7 = local_e8[2] - local_138[2];
              }
              else {
                lVar7 = local_138[2] - local_e8[2];
              }
              local_2a0 = (lVar7 + local_188[2]) / local_188[2];
              if (local_138[3] < local_e8[3]) {
                lVar7 = local_e8[3] - local_138[3];
              }
              else {
                lVar7 = local_138[3] - local_e8[3];
              }
              local_298 = (lVar7 + local_188[3]) / local_188[3];
              lVar7 = local_138[2];
              lVar9 = local_e8[2];
              lVar10 = local_138[1];
              lVar11 = local_e8[1];
              for (local_2b0 = 0; local_2b0 < local_298; local_2b0 = local_2b0 + 1) {
                if (lVar1 < lVar3) {
                  local_e8[3] = -(local_2b0 * local_188[3]);
                }
                else {
                  local_e8[3] = local_2b0 * local_188[3];
                }
                local_e8[3] = lVar3 + local_e8[3];
                local_138[3] = local_e8[3];
                for (local_2b8 = 0; local_2b8 < local_2a0; local_2b8 = local_2b8 + 1) {
                  if (lVar7 < lVar9) {
                    local_e8[2] = -(local_2b8 * local_188[2]);
                  }
                  else {
                    local_e8[2] = local_2b8 * local_188[2];
                  }
                  local_e8[2] = lVar9 + local_e8[2];
                  local_138[2] = local_e8[2];
                  for (local_2c0 = 0; local_2c0 < local_2a8; local_2c0 = local_2c0 + 1) {
                    if (lVar10 < lVar11) {
                      local_e8[1] = -(local_2c0 * local_188[1]);
                    }
                    else {
                      local_e8[1] = local_2c0 * local_188[1];
                    }
                    local_e8[1] = lVar11 + local_e8[1];
                    local_138[1] = local_e8[1];
                    if (local_34 == 8) {
                      in_stack_fffffffffffffcb8 = local_30;
                      ffgsvb(in_stack_00000020,in_stack_0000001c,in_stack_00000018,
                             (long *)in_stack_00000010,
                             (long *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                             (long *)outnaxes[0],(uchar)outnaxes[1],(uchar *)outnaxes[2],
                             (int *)outnaxes[3],(int *)outnaxes[4]);
                      ffpprb(fptr_01,(long)in_stack_fffffffffffffce8,(LONGLONG)fptr_00,
                             (LONGLONG)__ptr,(uchar *)in_stack_fffffffffffffcc8,
                             in_stack_fffffffffffffcc0);
                    }
                    else if (local_34 == 0x10) {
                      in_stack_fffffffffffffcb8 = local_30;
                      ffgsvi(in_stack_00000020,in_stack_0000001c,in_stack_00000018,
                             (long *)in_stack_00000010,
                             (long *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                             (long *)outnaxes[0],CONCAT11(outnaxes[1]._1_1_,(uchar)outnaxes[1]),
                             (short *)outnaxes[2],(int *)outnaxes[3],(int *)outnaxes[4]);
                      ffppri(fptr_01,(long)in_stack_fffffffffffffce8,(LONGLONG)fptr_00,
                             (LONGLONG)__ptr,(short *)in_stack_fffffffffffffcc8,
                             in_stack_fffffffffffffcc0);
                    }
                    else if (local_34 == 0x20) {
                      in_stack_fffffffffffffcb8 = local_30;
                      ffgsvk(in_stack_00000020,in_stack_0000001c,in_stack_00000018,
                             (long *)in_stack_00000010,
                             (long *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                             (long *)outnaxes[0],
                             CONCAT22(outnaxes[1]._2_2_,
                                      CONCAT11(outnaxes[1]._1_1_,(uchar)outnaxes[1])),
                             (int *)outnaxes[2],(int *)outnaxes[3],(int *)outnaxes[4]);
                      ffpprk(fptr_01,(long)in_stack_fffffffffffffce8,(LONGLONG)fptr_00,
                             (LONGLONG)__ptr,&in_stack_fffffffffffffcc8->HDUposition,
                             in_stack_fffffffffffffcc0);
                    }
                    else if (local_34 == -0x20) {
                      ffgsve(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr,
                             unaff_RBX,
                             (long *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                             (long *)buffsize,(float)((ulong)in_RDI >> 0x20),(float *)outsize,
                             (int *)outnaxes[0],
                             (int *)CONCAT44(outnaxes[1]._4_4_,
                                             CONCAT22(outnaxes[1]._2_2_,
                                                      CONCAT11(outnaxes[1]._1_1_,(uchar)outnaxes[1])
                                                     )));
                      ffppne(fptr_01,(long)in_stack_fffffffffffffce8,(LONGLONG)fptr_00,
                             (LONGLONG)__ptr,(float *)in_stack_fffffffffffffcc8,
                             (float)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                             &in_stack_fffffffffffffcb8->HDUposition);
                    }
                    else if (local_34 == -0x40) {
                      ffgsvd(in_stack_00000020,in_stack_0000001c,in_stack_00000018,
                             (long *)in_stack_00000010,
                             (long *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                             (long *)outnaxes[0],(double)unaff_RBX,
                             (double *)
                             CONCAT44(outnaxes[1]._4_4_,
                                      CONCAT22(outnaxes[1]._2_2_,
                                               CONCAT11(outnaxes[1]._1_1_,(uchar)outnaxes[1]))),
                             (int *)outnaxes[2],(int *)outnaxes[3]);
                      ffppnd(fptr_01,(long)in_stack_fffffffffffffce8,(LONGLONG)fptr_00,
                             (LONGLONG)__ptr,(double *)in_stack_fffffffffffffcc8,
                             (double)in_stack_fffffffffffffcc0,
                             &in_stack_fffffffffffffcb8->HDUposition);
                    }
                    else if (local_34 == 0x40) {
                      status_00 = (int *)&stack0xfffffffffffffdac;
                      in_stack_fffffffffffffcb8 = local_30;
                      ffgsvjj(in_stack_00000020,in_stack_0000001c,in_stack_00000018,
                              (long *)in_stack_00000010,
                              (long *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                              (long *)outnaxes[0],
                              CONCAT44(outnaxes[1]._4_4_,
                                       CONCAT22(outnaxes[1]._2_2_,
                                                CONCAT11(outnaxes[1]._1_1_,(uchar)outnaxes[1]))),
                              (LONGLONG *)outnaxes[2],(int *)outnaxes[3],(int *)outnaxes[4]);
                      ffpprjj(fptr_00,(long)__ptr,(LONGLONG)in_stack_fffffffffffffcc8,
                              (LONGLONG)in_stack_fffffffffffffcc0,
                              (LONGLONG *)in_stack_fffffffffffffcb8,status_00);
                    }
                  }
                }
              }
              free(__ptr);
              if (local_30->HDUposition < 1) {
                iVar4 = local_30->HDUposition;
              }
              else {
                ffpmsg((char *)0x134725);
                iVar4 = local_30->HDUposition;
              }
            }
          }
          else {
            iVar4 = local_30->HDUposition;
          }
        }
        else {
          ffpmsg((char *)0x1336de);
          iVar4 = local_30->HDUposition;
        }
      }
    }
    else {
      iVar4 = local_30->HDUposition;
    }
  }
  else {
    iVar4 = local_30->HDUposition;
  }
  return iVar4;
}

Assistant:

int fits_copy_image_section(
           fitsfile *fptr,  /* I - pointer to input image */
           fitsfile *newptr,  /* I - pointer to output image */
           char *expr,       /* I - Image section expression    */
           int *status)
{
  /*
     copies an image section from the input file to a new output HDU
  */

    int bitpix, naxis, numkeys, nkey;
    long naxes[] = {1,1,1,1,1,1,1,1,1}, smin, smax, sinc;
    long fpixels[] = {1,1,1,1,1,1,1,1,1};
    long lpixels[] = {1,1,1,1,1,1,1,1,1};
    long incs[] = {1,1,1,1,1,1,1,1,1};
    char *cptr, keyname[FLEN_KEYWORD], card[FLEN_CARD];
    int ii, tstatus, anynull;
    long minrow, maxrow, minslice, maxslice, mincube, maxcube;
    long firstpix;
    long ncubeiter, nsliceiter, nrowiter, kiter, jiter, iiter;
    int klen, kk, jj;
    long outnaxes[9], outsize, buffsize;
    double *buffer, crpix, cdelt;

    if (*status > 0)
        return(*status);

    /* get the size of the input image */
    fits_get_img_type(fptr, &bitpix, status);
    fits_get_img_dim(fptr, &naxis, status);
    if (fits_get_img_size(fptr, naxis, naxes, status) > 0)
        return(*status);

    if (naxis < 1 || naxis > 4)
    {
        ffpmsg(
        "Input image either had NAXIS = 0 (NULL image) or has > 4 dimensions");
        return(*status = BAD_NAXIS);
    }

    /* create output image with same size and type as the input image */
    /*  Will update the size later */
    fits_create_img(newptr, bitpix, naxis, naxes, status);

    /* copy all other non-structural keywords from the input to output file */
    fits_get_hdrspace(fptr, &numkeys, NULL, status);

    for (nkey = 4; nkey <= numkeys; nkey++) /* skip the first few keywords */
    {
        fits_read_record(fptr, nkey, card, status);

        if (fits_get_keyclass(card) > TYP_CMPRS_KEY)
        {
            /* write the record to the output file */
            fits_write_record(newptr, card, status);
        }
    }

    if (*status > 0)
    {
         ffpmsg("error copying header from input image to output image");
         return(*status);
    }

    /* parse the section specifier to get min, max, and inc for each axis */
    /* and the size of each output image axis */

    cptr = expr;
    for (ii=0; ii < naxis; ii++)
    {
       if (fits_get_section_range(&cptr, &smin, &smax, &sinc, status) > 0)
       {
          ffpmsg("error parsing the following image section specifier:");
          ffpmsg(expr);
          return(*status);
       }

       if (smax == 0)
          smax = naxes[ii];   /* use whole axis  by default */
       else if (smin == 0)
          smin = naxes[ii];   /* use inverted whole axis */

       if (smin > naxes[ii] || smax > naxes[ii])
       {
          ffpmsg("image section exceeds dimensions of input image:");
          ffpmsg(expr);
          return(*status = BAD_NAXIS);
       }

       fpixels[ii] = smin;
       lpixels[ii] = smax;
       incs[ii] = sinc;

       if (smin <= smax)
           outnaxes[ii] = (smax - smin + sinc) / sinc;
       else
           outnaxes[ii] = (smin - smax + sinc) / sinc;

       /* modify the NAXISn keyword */
       fits_make_keyn("NAXIS", ii + 1, keyname, status);
       fits_modify_key_lng(newptr, keyname, outnaxes[ii], NULL, status);

       /* modify the WCS keywords if necessary */

       if (fpixels[ii] != 1 || incs[ii] != 1)
       {
            for (kk=-1;kk<26; kk++)  /* modify any alternate WCS keywords */
	{
         /* read the CRPIXn keyword if it exists in the input file */
         fits_make_keyn("CRPIX", ii + 1, keyname, status);
	 
         if (kk != -1) {
	   klen = strlen(keyname);
	   keyname[klen]='A' + kk;
	   keyname[klen + 1] = '\0';
	 }

         tstatus = 0;
         if (fits_read_key(fptr, TDOUBLE, keyname, 
             &crpix, NULL, &tstatus) == 0)
         {
           /* calculate the new CRPIXn value */
           if (fpixels[ii] <= lpixels[ii]) {
             crpix = (crpix - (fpixels[ii])) / incs[ii] + 1.0;
              /*  crpix = (crpix - (fpixels[ii] - 1.0) - .5) / incs[ii] + 0.5; */
           } else {
             crpix = (fpixels[ii] - crpix)  / incs[ii] + 1.0;
             /* crpix = (fpixels[ii] - (crpix - 1.0) - .5) / incs[ii] + 0.5; */
           }

           /* modify the value in the output file */
           fits_modify_key_dbl(newptr, keyname, crpix, 15, NULL, status);

           if (incs[ii] != 1 || fpixels[ii] > lpixels[ii])
           {
             /* read the CDELTn keyword if it exists in the input file */
             fits_make_keyn("CDELT", ii + 1, keyname, status);

             if (kk != -1) {
	       klen = strlen(keyname);
	       keyname[klen]='A' + kk;
	       keyname[klen + 1] = '\0';
	     }

             tstatus = 0;
             if (fits_read_key(fptr, TDOUBLE, keyname, 
                 &cdelt, NULL, &tstatus) == 0)
             {
               /* calculate the new CDELTn value */
               if (fpixels[ii] <= lpixels[ii])
                 cdelt = cdelt * incs[ii];
               else
                 cdelt = cdelt * (-incs[ii]);
              
               /* modify the value in the output file */
               fits_modify_key_dbl(newptr, keyname, cdelt, 15, NULL, status);
             }

             /* modify the CDi_j keywords if they exist in the input file */

             fits_make_keyn("CD1_", ii + 1, keyname, status);

             if (kk != -1) {
	       klen = strlen(keyname);
	       keyname[klen]='A' + kk;
	       keyname[klen + 1] = '\0';
	     }

             for (jj=0; jj < 9; jj++)   /* look for up to 9 dimensions */
	     {
	       keyname[2] = '1' + jj;
	       
               tstatus = 0;
               if (fits_read_key(fptr, TDOUBLE, keyname, 
                 &cdelt, NULL, &tstatus) == 0)
               {
                 /* calculate the new CDi_j value */
                 if (fpixels[ii] <= lpixels[ii])
                   cdelt = cdelt * incs[ii];
                 else
                   cdelt = cdelt * (-incs[ii]);
              
                 /* modify the value in the output file */
                 fits_modify_key_dbl(newptr, keyname, cdelt, 15, NULL, status);
               }
	     }
	     
           } /* end of if (incs[ii]... loop */
         }   /* end of fits_read_key loop */
	}    /* end of for (kk  loop */
       }
    }  /* end of main NAXIS loop */

    if (ffrdef(newptr, status) > 0)  /* force the header to be scanned */
    {
        return(*status);
    }

    /* turn off any scaling of the pixel values */
    fits_set_bscale(fptr,  1.0, 0.0, status);
    fits_set_bscale(newptr, 1.0, 0.0, status);

    /* to reduce memory foot print, just read/write image 1 row at a time */

    outsize = outnaxes[0];
    buffsize = (abs(bitpix) / 8) * outsize;

    buffer = (double *) malloc(buffsize); /* allocate memory for the image row */
    if (!buffer)
    {
        ffpmsg("fits_copy_image_section: no memory for image section");
        return(*status = MEMORY_ALLOCATION);
    }

    /* read the image section then write it to the output file */

    minrow = fpixels[1];
    maxrow = lpixels[1];
    if (minrow > maxrow) {
        nrowiter = (minrow - maxrow + incs[1]) / incs[1];
    } else {
        nrowiter = (maxrow - minrow + incs[1]) / incs[1];
    }

    minslice = fpixels[2];
    maxslice = lpixels[2];
    if (minslice > maxslice) {
        nsliceiter = (minslice - maxslice + incs[2]) / incs[2];
    } else {
        nsliceiter = (maxslice - minslice + incs[2]) / incs[2];
    }

    mincube = fpixels[3];
    maxcube = lpixels[3];
    if (mincube > maxcube) {
        ncubeiter = (mincube - maxcube + incs[3]) / incs[3];
    } else {
        ncubeiter = (maxcube - mincube + incs[3]) / incs[3];
    }

    firstpix = 1;
    for (kiter = 0; kiter < ncubeiter; kiter++)
    {
      if (mincube > maxcube) {
	 fpixels[3] = mincube - (kiter * incs[3]);
      } else {
	 fpixels[3] = mincube + (kiter * incs[3]);
      }
      
      lpixels[3] = fpixels[3];

      for (jiter = 0; jiter < nsliceiter; jiter++)
      {
        if (minslice > maxslice) {
	    fpixels[2] = minslice - (jiter * incs[2]);
        } else {
	    fpixels[2] = minslice + (jiter * incs[2]);
        }

	lpixels[2] = fpixels[2];

        for (iiter = 0; iiter < nrowiter; iiter++)
        {
            if (minrow > maxrow) {
	       fpixels[1] = minrow - (iiter * incs[1]);
	    } else {
	       fpixels[1] = minrow + (iiter * incs[1]);
            }

	    lpixels[1] = fpixels[1];

	    if (bitpix == 8)
	    {
	        ffgsvb(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (unsigned char *) buffer, &anynull, status);

	        ffpprb(newptr, 1, firstpix, outsize, (unsigned char *) buffer, status);
	    }
	    else if (bitpix == 16)
	    {
	        ffgsvi(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (short *) buffer, &anynull, status);

	        ffppri(newptr, 1, firstpix, outsize, (short *) buffer, status);
	    }
	    else if (bitpix == 32)
	    {
	        ffgsvk(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (int *) buffer, &anynull, status);

	        ffpprk(newptr, 1, firstpix, outsize, (int *) buffer, status);
	    }
	    else if (bitpix == -32)
	    {
	        ffgsve(fptr, 1, naxis, naxes, fpixels, lpixels, incs, FLOATNULLVALUE,
	            (float *) buffer, &anynull, status);

	        ffppne(newptr, 1, firstpix, outsize, (float *) buffer, FLOATNULLVALUE, status);
	    }
	    else if (bitpix == -64)
	    {
	        ffgsvd(fptr, 1, naxis, naxes, fpixels, lpixels, incs, DOUBLENULLVALUE,
	             buffer, &anynull, status);

	        ffppnd(newptr, 1, firstpix, outsize, buffer, DOUBLENULLVALUE,
	               status);
	    }
	    else if (bitpix == 64)
	    {
	        ffgsvjj(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (LONGLONG *) buffer, &anynull, status);

	        ffpprjj(newptr, 1, firstpix, outsize, (LONGLONG *) buffer, status);
	    }

            firstpix += outsize;
        }
      }
    }

    free(buffer);  /* finished with the memory */

    if (*status > 0)
    {
        ffpmsg("fits_copy_image_section: error copying image section");
        return(*status);
    }

    return(*status);
}